

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_smf_midiout.cpp
# Opt level: O3

void __thiscall MIDISong2::MIDISong2(MIDISong2 *this,FileReader *reader,EMidiDevice type,char *args)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  ushort uVar4;
  int iVar5;
  BYTE *pBVar6;
  undefined4 extraout_var;
  TrackInfo *pTVar7;
  size_t *psVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  
  MIDIStreamer::MIDIStreamer(&this->super_MIDIStreamer,type,args);
  (this->super_MIDIStreamer).super_MusInfo._vptr_MusInfo = (_func_int **)&PTR__MIDISong2_006f0508;
  this->MusHeader = (BYTE *)0x0;
  this->Tracks = (TrackInfo *)0x0;
  iVar5 = (int)reader->Length;
  this->SongLen = iVar5;
  pBVar6 = (BYTE *)operator_new__((long)iVar5);
  this->MusHeader = pBVar6;
  iVar5 = (*(reader->super_FileReaderBase)._vptr_FileReaderBase[2])(reader,pBVar6,(long)iVar5);
  uVar2 = this->SongLen;
  if (((((CONCAT44(extraout_var,iVar5) == (long)(int)uVar2) &&
        (pBVar6 = this->MusHeader, pBVar6[4] == '\0')) && (pBVar6[5] == '\0')) &&
      ((pBVar6[6] == '\0' && (pBVar6[7] == '\x06')))) && (pBVar6[8] == '\0')) {
    bVar1 = pBVar6[9];
    if (bVar1 < 3) {
      this->Format = (uint)bVar1;
      if (bVar1 == 0) {
        uVar10 = 1;
      }
      else {
        uVar10 = (uint)(ushort)(*(ushort *)(pBVar6 + 10) << 8 | *(ushort *)(pBVar6 + 10) >> 8);
      }
      this->NumTracks = uVar10;
      uVar4 = *(ushort *)(pBVar6 + 0xc) << 8 | *(ushort *)(pBVar6 + 0xc) >> 8;
      (this->super_MIDIStreamer).Division = (uint)uVar4;
      if (uVar4 != 0) {
        pTVar7 = (TrackInfo *)operator_new__((ulong)(uVar10 << 6));
        this->Tracks = pTVar7;
        uVar9 = 0;
        if (6 < (int)uVar2 && uVar10 != 0) {
          psVar8 = &pTVar7->MaxTrackP;
          iVar5 = 0xe;
          uVar9 = 0;
          do {
            uVar3 = *(uint *)(pBVar6 + (long)iVar5 + 4);
            uVar11 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18
            ;
            uVar3 = (uVar2 - 8) - iVar5;
            if (iVar5 + uVar11 + 8 <= uVar2) {
              uVar3 = uVar11;
            }
            if (((pBVar6[iVar5] == 'M') && (pBVar6[(long)iVar5 + 1] == 'T')) &&
               ((pBVar6[(long)iVar5 + 2] == 'r' && (pBVar6[(long)iVar5 + 3] == 'k')))) {
              ((TrackInfo *)(psVar8 + -2))->TrackBegin = pBVar6 + (long)iVar5 + 8;
              psVar8[-1] = 0;
              *psVar8 = (ulong)uVar3;
            }
            uVar9 = uVar9 + 1;
            if (uVar10 <= uVar9) break;
            iVar5 = iVar5 + 8 + uVar3;
            psVar8 = psVar8 + 8;
          } while (iVar5 < (int)(uVar2 + 8));
        }
        this->NumTracks = (int)uVar9;
      }
    }
  }
  return;
}

Assistant:

MIDISong2::MIDISong2 (FileReader &reader, EMidiDevice type, const char *args)
: MIDIStreamer(type, args), MusHeader(0), Tracks(0)
{
	int p;
	int i;

#ifdef _WIN32
	if (ExitEvent == NULL)
	{
		return;
	}
#endif
	SongLen = reader.GetLength();
	MusHeader = new BYTE[SongLen];
	if (reader.Read(MusHeader, SongLen) != SongLen)
		return;

	// Do some validation of the MIDI file
	if (MusHeader[4] != 0 || MusHeader[5] != 0 || MusHeader[6] != 0 || MusHeader[7] != 6)
		return;

	if (MusHeader[8] != 0 || MusHeader[9] > 2)
		return;

	Format = MusHeader[9];

	if (Format == 0)
	{
		NumTracks = 1;
	}
	else
	{
		NumTracks = MusHeader[10] * 256 + MusHeader[11];
	}

	// The division is the number of pulses per quarter note (PPQN).
	Division = MusHeader[12] * 256 + MusHeader[13];
	if (Division == 0)
	{ // PPQN is zero? Then the song cannot play because it never pulses.
		return;
	}

	Tracks = new TrackInfo[NumTracks];

	// Gather information about each track
	for (i = 0, p = 14; i < NumTracks && p < SongLen + 8; ++i)
	{
		DWORD chunkLen =
			(MusHeader[p+4]<<24) |
			(MusHeader[p+5]<<16) |
			(MusHeader[p+6]<<8)  |
			(MusHeader[p+7]);

		if (chunkLen + p + 8 > (DWORD)SongLen)
		{ // Track too long, so truncate it
			chunkLen = SongLen - p - 8;
		}

		if (MusHeader[p+0] == 'M' &&
			MusHeader[p+1] == 'T' &&
			MusHeader[p+2] == 'r' &&
			MusHeader[p+3] == 'k')
		{
			Tracks[i].TrackBegin = MusHeader + p + 8;
			Tracks[i].TrackP = 0;
			Tracks[i].MaxTrackP = chunkLen;
		}

		p += chunkLen + 8;
	}

	// In case there were fewer actual chunks in the file than the
	// header specified, update NumTracks with the current value of i
	NumTracks = i;

	if (NumTracks == 0)
	{ // No tracks, so nothing to play
		return;
	}
}